

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

int __thiscall deqp::gls::LongStressCase::init(LongStressCase *this,EVP_PKEY_CTX *ctx)

{
  SharedPtr<tcu::TextureLevel> *pSVar1;
  long lVar2;
  ostringstream *this_00;
  SharedPtrStateBase **this_01;
  pointer *this_02;
  pointer pPVar3;
  TextureFormat TVar4;
  pointer puVar5;
  RenderContext *renderCtx;
  int iVar6;
  int extraout_EAX;
  long lVar7;
  ulong uVar8;
  long lVar9;
  TextureLevel *this_03;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *pGVar11;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar12;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar13;
  MessageBuilder *pMVar14;
  char *pcVar15;
  TestLog *pTVar16;
  DebugInfoRenderer *this_04;
  TestError *this_05;
  _Rb_tree_header *p_Var17;
  size_t __n;
  int precision;
  int precision_00;
  void *__buf;
  void *__buf_00;
  int prevProgCtxNdx;
  long lVar18;
  int i;
  int iVar19;
  long lVar20;
  pointer pPVar21;
  SharedPtr<tcu::TextureLevel> *other;
  uint uVar22;
  allocator<char> local_271b;
  allocator<char> local_271a;
  allocator<char> local_2719;
  vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
  *local_2718;
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *local_2710;
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  *local_2708;
  long local_2700;
  string local_26f8;
  string local_26d8;
  string local_26b8;
  string local_2698;
  string local_2678;
  string local_2658;
  string local_2638;
  string local_2618;
  string local_25f8;
  string local_25d8;
  string local_25b8;
  string local_2598;
  string local_2578;
  string local_2558;
  string local_2538;
  string local_2518;
  string local_24f8;
  string local_24d8;
  string local_24b8;
  string local_2498;
  LogSection local_2478;
  ShaderProgram prog;
  SharedPtr<tcu::TextureLevel> dummyTex;
  undefined1 local_2130 [8];
  ostream local_2128;
  TextureFormat format;
  ostringstream local_1fa8 [376];
  undefined1 local_1e30 [8];
  ostream local_1e28;
  undefined1 local_1cb0 [8];
  ostream local_1ca8;
  undefined1 local_1b30 [384];
  undefined1 local_19b0 [8];
  ostream local_19a8;
  undefined1 local_1830 [8];
  ostream local_1828;
  undefined1 local_16b0 [8];
  ostream local_16a8;
  undefined1 local_1530 [8];
  ostream local_1528;
  undefined1 local_13b0 [8];
  ostream local_13a8;
  undefined1 local_1230 [8];
  ostream local_1228;
  undefined1 local_10b0 [8];
  ostream local_10a8;
  undefined1 local_f30 [8];
  ostream local_f28;
  undefined1 local_db0 [8];
  ostream local_da8;
  undefined1 local_c30 [8];
  ostream local_c28;
  undefined1 local_ab0 [8];
  ostream local_aa8;
  undefined1 local_930 [8];
  ostream local_928;
  undefined1 local_7b0 [8];
  ostream local_7a8;
  undefined1 local_630 [8];
  ostream local_628;
  undefined1 local_4b0 [384];
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  ulong uVar10;
  
  local_2708 = &this->m_programResources;
  std::
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ::resize(local_2708,
           ((long)(this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_programContexts).
                 super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xa8);
  lVar18 = 0;
  do {
    pPVar21 = (this->m_programContexts).
              super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_programContexts).
                     super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar21) / 0xa8) <= lVar18)
    {
      puVar5 = (this->m_vertexIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_vertexIndices).
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar5) {
        (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar5;
      }
      for (iVar19 = 0; iVar19 < this->m_numVerticesPerDrawCall; iVar19 = iVar19 + 1) {
        prog.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT62(prog.m_shaders[0].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start._2_6_,(short)iVar19);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this->m_vertexIndices,(unsigned_short *)&prog);
      }
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                (&this->m_rnd,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  )(this->m_vertexIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  )(this->m_vertexIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      pGVar11 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)operator_new(0x48);
      (pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var17 = &(pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header;
      (pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var17->_M_header;
      (pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var17->_M_header;
      (pGVar11->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pGVar11->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pGVar11->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pGVar11->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_programs = pGVar11;
      pGVar12 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)operator_new(0x48);
      p_Var17 = &(pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header;
      (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var17->_M_header;
      (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var17->_M_header;
      (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pGVar12->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pGVar12->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pGVar12->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_buffers = pGVar12;
      pGVar13 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)operator_new(0x48);
      (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p_Var17 = &(pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header;
      (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var17->_M_header;
      (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var17->_M_header;
      (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pGVar13->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pGVar13->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pGVar13->m_garbageObjects).
      super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_textures = pGVar13;
      this->m_currentIteration = 0;
      local_2710 = (vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *)
                   ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_13b0 = (undefined1  [8])local_2710;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_13a8);
      std::operator<<(&local_13a8,"Number of iterations: ");
      local_2718 = (vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                    *)CONCAT44(local_2718._4_4_,this->m_numIterations);
      if (this->m_numIterations < 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_26f8,"infinite",&local_2719);
      }
      else {
        de::toString<int>(&local_26f8,&this->m_numIterations);
      }
      std::operator<<(&local_13a8,(string *)&local_26f8);
      local_4b0._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_13b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      std::operator<<((ostream *)(local_4b0 + 8),"Number of draw calls per iteration: ");
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_4b0,&this->m_numDrawCallsPerIteration);
      local_330._0_8_ =
           tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
      std::operator<<((ostream *)(local_330 + 8),"Number of triangles per draw call: ");
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_330,&this->m_numTrianglesPerDrawCall);
      local_1b0._0_8_ =
           tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Using triangle strips");
      local_19b0 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_19a8);
      std::operator<<(&local_19a8,"Approximate texture memory usage limit: ");
      de::floatToString_abi_cxx11_
                (&local_2498,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,
                 precision);
      std::operator<<(&local_19a8,(string *)&local_2498);
      std::operator<<(&local_19a8," MiB");
      local_1830 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_19b0,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1828);
      std::operator<<(&local_1828,"Approximate buffer memory usage limit: ");
      de::floatToString_abi_cxx11_
                (&local_24b8,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,
                 precision_00);
      std::operator<<(&local_1828,(string *)&local_24b8);
      std::operator<<(&local_1828," MiB");
      local_1230 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1830,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1228);
      std::operator<<(&local_1228,"Default vertex attribute data buffer usage parameter: ");
      pcVar15 = glu::getUsageName(this->m_attrBufferUsage);
      std::operator<<(&local_1228,pcVar15);
      local_10b0 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1230,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_10a8);
      std::operator<<(&local_10a8,"Default vertex index data buffer usage parameter: ");
      pcVar15 = glu::getUsageName(this->m_indexBufferUsage);
      std::operator<<(&local_10a8,pcVar15);
      pTVar16 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_10b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                          );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_24d8,"ProbabilityParams",&local_271a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_24f8,"Per-iteration probability parameters",&local_271b);
      tcu::LogSection::LogSection(&local_2478,&local_24d8,&local_24f8);
      tcu::LogSection::write(&local_2478,(int)pTVar16,__buf,(size_t)p_Var17);
      local_f30 = (undefined1  [8])pTVar16;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_f28);
      pcVar15 = "Program re-build: ";
      std::operator<<(&local_f28,"Program re-build: ");
      probabilityStr_abi_cxx11_(&local_2518,(gls *)pcVar15,(this->m_probabilities).rebuildProgram);
      std::operator<<(&local_f28,(string *)&local_2518);
      local_db0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_f30,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_da8);
      pcVar15 = "Texture re-upload: ";
      std::operator<<(&local_da8,"Texture re-upload: ");
      probabilityStr_abi_cxx11_(&local_2538,(gls *)pcVar15,(this->m_probabilities).reuploadTexture);
      std::operator<<(&local_da8,(string *)&local_2538);
      local_c30 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_db0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_c28);
      pcVar15 = "Buffer re-upload: ";
      std::operator<<(&local_c28,"Buffer re-upload: ");
      probabilityStr_abi_cxx11_(&local_2558,(gls *)pcVar15,(this->m_probabilities).reuploadBuffer);
      std::operator<<(&local_c28,(string *)&local_2558);
      local_ab0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_c30,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_aa8);
      pcVar15 = "Use glTexImage* instead of glTexSubImage* when uploading texture: ";
      std::operator<<(&local_aa8,
                      "Use glTexImage* instead of glTexSubImage* when uploading texture: ");
      probabilityStr_abi_cxx11_
                (&local_2578,(gls *)pcVar15,(this->m_probabilities).reuploadWithTexImage);
      std::operator<<(&local_aa8,(string *)&local_2578);
      local_930 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_ab0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_928);
      pcVar15 = "Use glBufferData* instead of glBufferSubData* when uploading buffer: ";
      std::operator<<(&local_928,
                      "Use glBufferData* instead of glBufferSubData* when uploading buffer: ");
      probabilityStr_abi_cxx11_
                (&local_2598,(gls *)pcVar15,(this->m_probabilities).reuploadWithBufferData);
      std::operator<<(&local_928,(string *)&local_2598);
      local_7b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_930,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      pcVar15 = "Delete texture after using it, even if could re-use it: ";
      std::operator<<(&local_7a8,"Delete texture after using it, even if could re-use it: ");
      probabilityStr_abi_cxx11_(&local_25b8,(gls *)pcVar15,(this->m_probabilities).deleteTexture);
      std::operator<<(&local_7a8,(string *)&local_25b8);
      local_630 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_7b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
      pcVar15 = "Delete buffer after using it, even if could re-use it: ";
      std::operator<<(&local_628,"Delete buffer after using it, even if could re-use it: ");
      probabilityStr_abi_cxx11_(&local_25d8,(gls *)pcVar15,(this->m_probabilities).deleteBuffer);
      std::operator<<(&local_628,(string *)&local_25d8);
      local_16b0 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_630,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_16a8);
      pcVar15 = "Don\'t re-use texture, and only delete if memory limit is hit: ";
      std::operator<<(&local_16a8,"Don\'t re-use texture, and only delete if memory limit is hit: ")
      ;
      probabilityStr_abi_cxx11_
                (&local_25f8,(gls *)pcVar15,(this->m_probabilities).wastefulTextureMemoryUsage);
      std::operator<<(&local_16a8,(string *)&local_25f8);
      local_1530 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_16b0,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1528);
      pcVar15 = "Don\'t re-use buffer, and only delete if memory limit is hit: ";
      std::operator<<(&local_1528,"Don\'t re-use buffer, and only delete if memory limit is hit: ");
      probabilityStr_abi_cxx11_
                (&local_2618,(gls *)pcVar15,(this->m_probabilities).wastefulBufferMemoryUsage);
      std::operator<<(&local_1528,(string *)&local_2618);
      local_2130 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1530,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2128);
      pcVar15 = "Use client memory (instead of GL buffers) for vertex attribute data: ";
      std::operator<<(&local_2128,
                      "Use client memory (instead of GL buffers) for vertex attribute data: ");
      probabilityStr_abi_cxx11_
                (&local_2638,(gls *)pcVar15,(this->m_probabilities).clientMemoryAttributeData);
      std::operator<<(&local_2128,(string *)&local_2638);
      local_1e30 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_2130,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e28);
      pcVar15 = "Use client memory (instead of GL buffers) for vertex index data: ";
      std::operator<<(&local_1e28,
                      "Use client memory (instead of GL buffers) for vertex index data: ");
      probabilityStr_abi_cxx11_
                (&local_2658,(gls *)pcVar15,(this->m_probabilities).clientMemoryIndexData);
      std::operator<<(&local_1e28,(string *)&local_2658);
      local_1cb0 = (undefined1  [8])
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1e30,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1ca8);
      pcVar15 = "Use random target parameter when uploading buffer data: ";
      std::operator<<(&local_1ca8,"Use random target parameter when uploading buffer data: ");
      probabilityStr_abi_cxx11_
                (&local_2678,(gls *)pcVar15,(this->m_probabilities).randomBufferUploadTarget);
      std::operator<<(&local_1ca8,(string *)&local_2678);
      local_1b30._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1cb0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_00 = (ostringstream *)(local_1b30 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      pcVar15 = "Use random usage parameter when uploading buffer data: ";
      std::operator<<((ostream *)this_00,"Use random usage parameter when uploading buffer data: ");
      probabilityStr_abi_cxx11_
                (&local_2698,(gls *)pcVar15,(this->m_probabilities).randomBufferUsage);
      std::operator<<((ostream *)this_00,(string *)&local_2698);
      format = (TextureFormat)
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b30,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::ostringstream::ostringstream(local_1fa8);
      pcVar15 = "Use glDrawArrays instead of glDrawElements: ";
      std::operator<<((ostream *)local_1fa8,"Use glDrawArrays instead of glDrawElements: ");
      probabilityStr_abi_cxx11_(&local_26b8,(gls *)pcVar15,(this->m_probabilities).useDrawArrays);
      std::operator<<((ostream *)local_1fa8,(string *)&local_26b8);
      dummyTex.m_ptr =
           (TextureLevel *)
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&format,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = &dummyTex.m_state;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      pcVar15 = "Use separate buffers for each attribute, instead of one array for all: ";
      std::operator<<((ostream *)this_01,
                      "Use separate buffers for each attribute, instead of one array for all: ");
      probabilityStr_abi_cxx11_
                (&local_26d8,(gls *)pcVar15,(this->m_probabilities).separateAttributeBuffers);
      std::operator<<((ostream *)this_01,(string *)&local_26d8);
      pTVar16 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&dummyTex,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      tcu::TestLog::endSection(pTVar16);
      this_02 = &prog.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      prog.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar16;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
      std::operator<<((ostream *)this_02,"Using ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_02);
      std::operator<<((ostream *)this_02," program(s)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&prog,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
      std::__cxx11::string::~string((string *)&local_26d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::__cxx11::string::~string((string *)&local_26b8);
      std::__cxx11::ostringstream::~ostringstream(local_1fa8);
      std::__cxx11::string::~string((string *)&local_2698);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::__cxx11::string::~string((string *)&local_2678);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1ca8);
      std::__cxx11::string::~string((string *)&local_2658);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e28);
      std::__cxx11::string::~string((string *)&local_2638);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2128);
      std::__cxx11::string::~string((string *)&local_2618);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1528);
      std::__cxx11::string::~string((string *)&local_25f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_16a8);
      std::__cxx11::string::~string((string *)&local_25d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
      std::__cxx11::string::~string((string *)&local_25b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_2598);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_928);
      std::__cxx11::string::~string((string *)&local_2578);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_aa8);
      std::__cxx11::string::~string((string *)&local_2558);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_c28);
      std::__cxx11::string::~string((string *)&local_2538);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_da8);
      std::__cxx11::string::~string((string *)&local_2518);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_f28);
      tcu::LogSection::~LogSection(&local_2478);
      std::__cxx11::string::~string((string *)&local_24f8);
      std::__cxx11::string::~string((string *)&local_24d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_10a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1228);
      std::__cxx11::string::~string((string *)&local_24b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1828);
      std::__cxx11::string::~string((string *)&local_2498);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_19a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4b0 + 8));
      std::__cxx11::string::~string((string *)&local_26f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_13a8);
      iVar19 = 0;
      uVar22 = 0;
      while( true ) {
        local_2130._0_4_ = iVar19;
        pPVar21 = (this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __n = 0xa8;
        iVar6 = (int)(((long)(this->m_programContexts).
                             super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar21) / 0xa8);
        if (iVar6 <= iVar19) break;
        local_2718 = (vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                      *)CONCAT44(local_2718._4_4_,uVar22);
        renderCtx = this->m_renderCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b30,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)local_1530);
        pPVar21 = pPVar21 + iVar19;
        mangleShaderNames((string *)&format,&pPVar21->vertexSource,(string *)local_1b30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e30,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)local_16b0);
        mangleShaderNames((string *)local_1cb0,&pPVar21->fragmentSource,(string *)local_1e30);
        glu::makeVtxFragSources((ProgramSources *)&dummyTex,(string *)&format,(string *)local_1cb0);
        glu::ShaderProgram::ShaderProgram(&prog,renderCtx,(ProgramSources *)&dummyTex);
        glu::ProgramSources::~ProgramSources((ProgramSources *)&dummyTex);
        std::__cxx11::string::~string((string *)local_1cb0);
        std::__cxx11::string::~string((string *)local_1e30);
        std::__cxx11::string::~string((string *)&format);
        std::__cxx11::string::~string((string *)local_1b30);
        de::toString<int>((string *)local_1b30,(int *)local_2130);
        std::operator+((string *)&format,"ShaderProgram",(string *)local_1b30);
        de::toString<int>((string *)local_1e30,(int *)local_2130);
        std::operator+((string *)local_1cb0,"Shader program ",(string *)local_1e30);
        tcu::LogSection::LogSection((LogSection *)&dummyTex,(string *)&format,(string *)local_1cb0);
        tcu::LogSection::write((LogSection *)&dummyTex,(int)local_2710,__buf_00,__n);
        pTVar16 = glu::operator<<((TestLog *)local_2710,&prog);
        tcu::TestLog::endSection(pTVar16);
        tcu::LogSection::~LogSection((LogSection *)&dummyTex);
        std::__cxx11::string::~string((string *)local_1cb0);
        std::__cxx11::string::~string((string *)local_1e30);
        std::__cxx11::string::~string((string *)&format);
        std::__cxx11::string::~string((string *)local_1b30);
        uVar22 = CONCAT31((int3)((ulong)local_2718 >> 8),
                          (byte)local_2718 | prog.m_program.m_info.linkOk ^ 1U);
        glu::ShaderProgram::~ShaderProgram(&prog);
        iVar19 = local_2130._0_4_ + 1;
      }
      if ((uVar22 & 1) == 0) {
        if (this->m_showDebugInfo == true) {
          this_04 = (DebugInfoRenderer *)operator_new(0x40);
          LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer(this_04,this->m_renderCtx);
          this->m_debugInfoRenderer = this_04;
          iVar6 = extraout_EAX;
        }
        return iVar6;
      }
      this_05 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prog,"One or more shader programs failed to compile",
                 (allocator<char> *)&dummyTex);
      tcu::TestError::TestError(this_05,(string *)&prog);
      __cxa_throw(this_05,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_2710 = &pPVar21[lVar18].textureSpecs;
    local_2718 = &(local_2708->
                  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar18].dummyTextures;
    lVar20 = 0;
    local_2700 = lVar18;
    while( true ) {
      lVar18 = *(long *)&(local_2710->
                         super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                         )._M_impl.super__Vector_impl_data;
      if ((int)(((long)*(pointer *)
                        ((long)&(local_2710->
                                super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                )._M_impl.super__Vector_impl_data + 8) - lVar18) / 0x50) <= lVar20)
      break;
      lVar7 = lVar20 * 0x50;
      lVar2 = lVar18 + lVar7;
      format = glu::mapGLTransferFormat
                         (*(deUint32 *)(lVar18 + 0x10 + lVar7),*(deUint32 *)(lVar18 + 0x14 + lVar7))
      ;
      dummyTex.m_ptr = (TextureLevel *)0x0;
      dummyTex.m_state = (SharedPtrStateBase *)0x0;
      for (lVar18 = 0;
          pPVar3 = (this->m_programResources).
                   super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar18 < (int)((ulong)((long)(this->m_programResources).
                                       super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) >>
                        7); lVar18 = lVar18 + 1) {
        lVar7 = *(long *)&pPVar3[lVar18].dummyTextures.
                          super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                          ._M_impl;
        uVar8 = (ulong)((long)*(pointer *)
                               ((long)&pPVar3[lVar18].dummyTextures.
                                       super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                       ._M_impl + 8) - lVar7) >> 4;
        uVar10 = uVar8 & 0xffffffff;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar9 = uVar10 + 1;
        other = (SharedPtr<tcu::TextureLevel> *)(lVar7 + -0x10);
        do {
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_014b9caa;
          pSVar1 = other + 1;
          other = other + 1;
          TVar4 = pSVar1->m_ptr->m_format;
        } while ((format.order != TVar4.order) || (format.type != TVar4.type));
        de::SharedPtr<tcu::TextureLevel>::operator=(&dummyTex,other);
LAB_014b9caa:
      }
      if (dummyTex.m_ptr == (TextureLevel *)0x0) {
        this_03 = (TextureLevel *)operator_new(0x28);
        tcu::TextureLevel::TextureLevel(this_03,&format);
        de::SharedPtr<tcu::TextureLevel>::SharedPtr((SharedPtr<tcu::TextureLevel> *)&prog,this_03);
        de::SharedPtr<tcu::TextureLevel>::operator=(&dummyTex,(SharedPtr<tcu::TextureLevel> *)&prog)
        ;
        de::SharedPtr<tcu::TextureLevel>::release((SharedPtr<tcu::TextureLevel> *)&prog);
      }
      if (((dummyTex.m_ptr)->m_size).m_data[0] < *(int *)(lVar2 + 8)) {
        iVar19 = *(int *)(lVar2 + 0xc);
LAB_014b9d22:
        tcu::TextureLevel::setSize(dummyTex.m_ptr,*(int *)(lVar2 + 8),iVar19,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&prog,dummyTex.m_ptr);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)&prog,(Vec4 *)(lVar2 + 0x30),(Vec4 *)(lVar2 + 0x40));
      }
      else {
        iVar19 = *(int *)(lVar2 + 0xc);
        if (((dummyTex.m_ptr)->m_size).m_data[1] < iVar19) goto LAB_014b9d22;
      }
      std::
      vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>::
      push_back(local_2718,&dummyTex);
      de::SharedPtr<tcu::TextureLevel>::release(&dummyTex);
      lVar20 = lVar20 + 1;
    }
    lVar18 = local_2700 + 1;
  } while( true );
}

Assistant:

void LongStressCase::init (void)
{
	// Generate dummy texture data for each texture spec in m_programContexts.

	DE_ASSERT(!m_programContexts.empty());
	DE_ASSERT(m_programResources.empty());
	m_programResources.resize(m_programContexts.size());

	for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
	{
		const ProgramContext&	progCtx = m_programContexts[progCtxNdx];
		ProgramResources&		progRes = m_programResources[progCtxNdx];

		for (int texSpecNdx = 0; texSpecNdx < (int)progCtx.textureSpecs.size(); texSpecNdx++)
		{
			const TextureSpec&		spec	= progCtx.textureSpecs[texSpecNdx];
			const TextureFormat		format	= glu::mapGLTransferFormat(spec.format, spec.dataType);

			// If texture data with the same format has already been generated, re-use that (don't care much about contents).

			SharedPtr<TextureLevel> dummyTex;

			for (int prevProgCtxNdx = 0; prevProgCtxNdx < (int)m_programResources.size(); prevProgCtxNdx++)
			{
				const vector<SharedPtr<TextureLevel> >& prevProgCtxTextures = m_programResources[prevProgCtxNdx].dummyTextures;

				for (int texNdx = 0; texNdx < (int)prevProgCtxTextures.size(); texNdx++)
				{
					if (prevProgCtxTextures[texNdx]->getFormat() == format)
					{
						dummyTex = prevProgCtxTextures[texNdx];
						break;
					}
				}
			}

			if (!dummyTex)
				dummyTex = SharedPtr<TextureLevel>(new TextureLevel(format));

			if (dummyTex->getWidth() < spec.width || dummyTex->getHeight() < spec.height)
			{
				dummyTex->setSize(spec.width, spec.height);
				tcu::fillWithComponentGradients(dummyTex->getAccess(), spec.minValue, spec.maxValue);
			}

			progRes.dummyTextures.push_back(dummyTex);
		}
	}

	m_vertexIndices.clear();
	for (int i = 0; i < m_numVerticesPerDrawCall; i++)
		m_vertexIndices.push_back((deUint16)i);
	m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

	DE_ASSERT(!m_programs && !m_buffers && !m_textures);
	m_programs = new GLObjectManager<Program>;
	m_buffers = new GLObjectManager<Buffer>;
	m_textures = new GLObjectManager<Texture>;

	m_currentIteration = 0;

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Number of iterations: "										<< (m_numIterations > 0 ? toString(m_numIterations) : "infinite")				<< TestLog::EndMessage
			<< TestLog::Message << "Number of draw calls per iteration: "						<< m_numDrawCallsPerIteration													<< TestLog::EndMessage
			<< TestLog::Message << "Number of triangles per draw call: "						<< m_numTrianglesPerDrawCall													<< TestLog::EndMessage
			<< TestLog::Message << "Using triangle strips"																														<< TestLog::EndMessage
			<< TestLog::Message << "Approximate texture memory usage limit: "					<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Approximate buffer memory usage limit: "					<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex attribute data buffer usage parameter: "		<< glu::getUsageName(m_attrBufferUsage)											<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex index data buffer usage parameter: "			<< glu::getUsageName(m_indexBufferUsage)										<< TestLog::EndMessage

			<< TestLog::Section("ProbabilityParams", "Per-iteration probability parameters")
			<< TestLog::Message << "Program re-build: "															<< probabilityStr(m_probabilities.rebuildProgram)				<< TestLog::EndMessage
			<< TestLog::Message << "Texture re-upload: "														<< probabilityStr(m_probabilities.reuploadTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Buffer re-upload: "															<< probabilityStr(m_probabilities.reuploadBuffer)				<< TestLog::EndMessage
			<< TestLog::Message << "Use glTexImage* instead of glTexSubImage* when uploading texture: "			<< probabilityStr(m_probabilities.reuploadWithTexImage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glBufferData* instead of glBufferSubData* when uploading buffer: "		<< probabilityStr(m_probabilities.reuploadWithBufferData)		<< TestLog::EndMessage
			<< TestLog::Message << "Delete texture after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Delete buffer after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteBuffer)					<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use texture, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulTextureMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use buffer, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulBufferMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex attribute data: "		<< probabilityStr(m_probabilities.clientMemoryAttributeData)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex index data: "			<< probabilityStr(m_probabilities.clientMemoryIndexData)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random target parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUploadTarget)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random usage parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUsage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glDrawArrays instead of glDrawElements: "								<< probabilityStr(m_probabilities.useDrawArrays)				<< TestLog::EndMessage
			<< TestLog::Message << "Use separate buffers for each attribute, instead of one array for all: "	<< probabilityStr(m_probabilities.separateAttributeBuffers)		<< TestLog::EndMessage
			<< TestLog::EndSection
			<< TestLog::Message << "Using " << m_programContexts.size() << " program(s)" << TestLog::EndMessage;

		bool anyProgramsFailed = false;
		for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
		{
			const ProgramContext& progCtx = m_programContexts[progCtxNdx];
			glu::ShaderProgram prog(m_renderCtx, glu::makeVtxFragSources(mangleShaderNames(progCtx.vertexSource, ""), mangleShaderNames(progCtx.fragmentSource, "")));
			log << TestLog::Section("ShaderProgram" + toString(progCtxNdx), "Shader program " + toString(progCtxNdx)) << prog << TestLog::EndSection;
			if (!prog.isOk())
				anyProgramsFailed = true;
		}

		if (anyProgramsFailed)
			throw tcu::TestError("One or more shader programs failed to compile");
	}

	DE_ASSERT(!m_debugInfoRenderer);
	if (m_showDebugInfo)
		m_debugInfoRenderer = new DebugInfoRenderer(m_renderCtx);
}